

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionKalman4.cpp
# Opt level: O0

void __thiscall RTFusionKalman4::update(RTFusionKalman4 *this)

{
  char *pcVar1;
  RTMatrix4x4 local_1d0;
  RTQuaternion local_190;
  RTMatrix4x4 local_180;
  RTMatrix4x4 local_140;
  RTMatrix4x4 local_100;
  RTQuaternion local_c0;
  RTQuaternion local_b0;
  undefined1 local_a0 [8];
  RTMatrix4x4 SkInverse;
  RTMatrix4x4 Sk;
  RTQuaternion delta;
  RTFusionKalman4 *this_local;
  
  RTQuaternion::RTQuaternion((RTQuaternion *)(Sk.m_data[3] + 2));
  RTMatrix4x4::RTMatrix4x4((RTMatrix4x4 *)(SkInverse.m_data[3] + 2));
  RTMatrix4x4::RTMatrix4x4((RTMatrix4x4 *)local_a0);
  if ((((this->super_RTFusion).m_enableCompass & 1U) == 0) &&
     (((this->super_RTFusion).m_enableAccel & 1U) == 0)) {
    RTQuaternion::RTQuaternion(&local_c0);
    RTQuaternion::operator=(&this->m_stateQError,&local_c0);
  }
  else {
    local_b0 = RTQuaternion::operator-(&(this->super_RTFusion).m_measuredQPose,&this->m_stateQ);
    RTQuaternion::operator=(&this->m_stateQError,&local_b0);
  }
  RTMatrix4x4::operator+(&local_100,&this->m_Pkk_1,&this->m_Rk);
  RTMatrix4x4::operator=((RTMatrix4x4 *)(SkInverse.m_data[3] + 2),&local_100);
  RTMatrix4x4::inverted(&local_140,(RTMatrix4x4 *)(SkInverse.m_data[3] + 2));
  RTMatrix4x4::operator=((RTMatrix4x4 *)local_a0,&local_140);
  RTMatrix4x4::operator*(&local_180,&this->m_Pkk_1,(RTMatrix4x4 *)local_a0);
  RTMatrix4x4::operator=(&this->m_Kk,&local_180);
  if (((this->super_RTFusion).m_debug & 1U) != 0) {
    pcVar1 = RTMath::display("Gain",&this->m_Kk);
    printf("%s",pcVar1);
    fflush(_stdout);
  }
  local_190 = RTMatrix4x4::operator*(&this->m_Kk,&this->m_stateQError);
  RTQuaternion::operator=((RTQuaternion *)(Sk.m_data[3] + 2),&local_190);
  RTQuaternion::operator+=(&this->m_stateQ,(RTQuaternion *)(Sk.m_data[3] + 2));
  RTQuaternion::normalize(&this->m_stateQ);
  RTMatrix4x4::setToIdentity(&this->m_Pkk);
  RTMatrix4x4::operator-=(&this->m_Pkk,&this->m_Kk);
  RTMatrix4x4::operator*(&local_1d0,&this->m_Pkk,&this->m_Pkk_1);
  RTMatrix4x4::operator=(&this->m_Pkk,&local_1d0);
  if (((this->super_RTFusion).m_debug & 1U) != 0) {
    pcVar1 = RTMath::display("Cov",&this->m_Pkk);
    printf("%s",pcVar1);
    fflush(_stdout);
  }
  return;
}

Assistant:

void RTFusionKalman4::update()
{
    RTQuaternion delta;
    RTMatrix4x4 Sk, SkInverse;

    if (m_enableCompass || m_enableAccel) {
        m_stateQError = m_measuredQPose - m_stateQ;
    } else {
        m_stateQError = RTQuaternion();
    }

    //	Compute residual covariance Sk = Hk * Pkk_1 * HkTranspose + Rk
    //  Note: since Hk is the identity matrix, this has been simplified

    Sk = m_Pkk_1 + m_Rk;

    //	Compute Kalman gain Kk = Pkk_1 * HkTranspose * SkInverse
    //  Note: again, the HkTranspose part is omitted

    SkInverse = Sk.inverted();

    m_Kk = m_Pkk_1 * SkInverse;

    if (m_debug)
        HAL_INFO(RTMath::display("Gain", m_Kk));

    // make new state estimate

    delta = m_Kk * m_stateQError;

    m_stateQ += delta;

    m_stateQ.normalize();

    //  produce new estimate covariance Pkk = (I - Kk * Hk) * Pkk_1
    //  Note: since Hk is the identity matrix, it is omitted

    m_Pkk.setToIdentity();
    m_Pkk -= m_Kk;
    m_Pkk = m_Pkk * m_Pkk_1;

    if (m_debug)
        HAL_INFO(RTMath::display("Cov", m_Pkk));
}